

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int Cec_GiaSplitTest2(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                     int fVeryVerbose,int fSilent)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  abctime aVar11;
  Cnf_Dat_t *p_00;
  Gia_Man_t *pGVar12;
  Vec_Int_t *pVVar13;
  double dVar14;
  int local_ac;
  Gia_Man_t *pPart;
  int iVar;
  int Cost;
  int nFanouts;
  int Depth;
  Gia_Man_t *pLast;
  double Progress;
  int local_58;
  int RetValue;
  int status;
  int nIter;
  int nSatConfs;
  int nSatVars;
  Cnf_Dat_t *pCnf;
  Vec_Ptr_t *vStack;
  abctime clkTotal;
  int local_28;
  int fVerbose_local;
  int LookAhead_local;
  int nIterMax_local;
  int nTimeOut_local;
  int nProcs_local;
  Gia_Man_t *p_local;
  
  clkTotal._4_4_ = fVerbose;
  local_28 = LookAhead;
  fVerbose_local = nIterMax;
  LookAhead_local = nTimeOut;
  nIterMax_local = nProcs;
  _nTimeOut_local = p;
  vStack = (Vec_Ptr_t *)Abc_Clock();
  Progress._4_4_ = -1;
  pLast = (Gia_Man_t *)0x0;
  _nSatConfs = Cec_GiaDeriveGiaRemapped(_nTimeOut_local);
  local_58 = Cnf_GiaSolveOne(_nTimeOut_local,_nSatConfs,LookAhead_local,&nIter,&status);
  Cnf_DataFree(_nSatConfs);
  iVar5 = nIter;
  iVar4 = status;
  iVar8 = local_58;
  pGVar12 = pLast;
  if (clkTotal._4_4_ != 0) {
    aVar11 = Abc_Clock();
    Cec_GiaSplitPrint(0,0,iVar5,iVar4,iVar8,(double)pGVar12,aVar11 - (long)vStack);
  }
  if (local_58 == 0) {
    if (fSilent == 0) {
      printf("The problem is SAT without cofactoring.\n");
    }
    p_local._4_4_ = 0;
  }
  else if (local_58 == 1) {
    if (fSilent == 0) {
      printf("The problem is UNSAT without cofactoring.\n");
    }
    p_local._4_4_ = 1;
  }
  else {
    if (local_58 != -1) {
      __assert_fail("status == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSplit.c"
                    ,0x1b0,"int Cec_GiaSplitTest2(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    p_00 = (Cnf_Dat_t *)Vec_PtrAlloc(1000);
    pCnf = p_00;
    pGVar12 = Gia_ManDup(_nTimeOut_local);
    Vec_PtrPush((Vec_Ptr_t *)p_00,pGVar12);
    RetValue = 1;
    while (iVar8 = Vec_PtrSize((Vec_Ptr_t *)pCnf), 0 < iVar8) {
      _nFanouts = (Gia_Man_t *)Vec_PtrPop((Vec_Ptr_t *)pCnf);
      if (_nFanouts->vCofVars == (Vec_Int_t *)0x0) {
        local_ac = 0;
      }
      else {
        local_ac = Vec_IntSize(_nFanouts->vCofVars);
      }
      Cost = local_ac + 1;
      pPart._0_4_ = Gia_SplitCofVar(_nFanouts,local_28,&iVar,(int *)((long)&pPart + 4));
      pGVar12 = Gia_ManDupCofactorVar(_nFanouts,(uint)pPart,0);
      if (_nFanouts->vCofVars == (Vec_Int_t *)0x0) {
        pVVar13 = Vec_IntAlloc(100);
        _nFanouts->vCofVars = pVVar13;
      }
      iVar8 = iVar;
      uVar2 = pPart._4_4_;
      uVar1 = (uint)pPart;
      if (fVeryVerbose != 0) {
        uVar9 = Gia_ManAndNum(_nFanouts);
        uVar10 = Gia_ManAndNum(pGVar12);
        printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n",
               (ulong)uVar1,(ulong)(uint)iVar8,(ulong)uVar2,(ulong)uVar9,(ulong)uVar10);
      }
      iVar8 = Vec_IntSize(_nFanouts->vCofVars);
      pVVar13 = Vec_IntAlloc(iVar8 + 1);
      pGVar12->vCofVars = pVVar13;
      Vec_IntAppend(pGVar12->vCofVars,_nFanouts->vCofVars);
      pVVar13 = pGVar12->vCofVars;
      iVar8 = Abc_Var2Lit((uint)pPart,1);
      Vec_IntPush(pVVar13,iVar8);
      _nSatConfs = Cec_GiaDeriveGiaRemapped(pGVar12);
      local_58 = Cnf_GiaSolveOne(pGVar12,_nSatConfs,LookAhead_local,&nIter,&status);
      Cnf_DataFree(_nSatConfs);
      if (local_58 == 1) {
        dVar14 = pow(2.0,(double)Cost);
        pLast = (Gia_Man_t *)(1.0 / dVar14 + (double)pLast);
      }
      iVar7 = nIter;
      iVar6 = status;
      iVar5 = RetValue;
      iVar4 = local_58;
      pGVar3 = pLast;
      iVar8 = Cost;
      if (clkTotal._4_4_ != 0) {
        aVar11 = Abc_Clock();
        Cec_GiaSplitPrint(iVar5,iVar8,iVar7,iVar6,iVar4,(double)pGVar3,aVar11 - (long)vStack);
      }
      if (local_58 == 0) {
        _nTimeOut_local->pCexComb = pGVar12->pCexComb;
        pGVar12->pCexComb = (Abc_Cex_t *)0x0;
        Gia_ManStop(_nFanouts);
        Gia_ManStop(pGVar12);
        Progress._4_4_ = 0;
        break;
      }
      if (local_58 == 1) {
        Gia_ManStop(pGVar12);
      }
      else {
        Vec_PtrPush((Vec_Ptr_t *)pCnf,pGVar12);
      }
      pGVar12 = Gia_ManDupCofactorVar(_nFanouts,(uint)pPart,1);
      iVar8 = Vec_IntSize(_nFanouts->vCofVars);
      pVVar13 = Vec_IntAlloc(iVar8 + 1);
      pGVar12->vCofVars = pVVar13;
      Vec_IntAppend(pGVar12->vCofVars,_nFanouts->vCofVars);
      pVVar13 = pGVar12->vCofVars;
      iVar8 = Abc_Var2Lit((uint)pPart,0);
      Vec_IntPush(pVVar13,iVar8);
      Gia_ManStop(_nFanouts);
      _nSatConfs = Cec_GiaDeriveGiaRemapped(pGVar12);
      local_58 = Cnf_GiaSolveOne(pGVar12,_nSatConfs,LookAhead_local,&nIter,&status);
      Cnf_DataFree(_nSatConfs);
      if (local_58 == 1) {
        dVar14 = pow(2.0,(double)Cost);
        pLast = (Gia_Man_t *)(1.0 / dVar14 + (double)pLast);
      }
      iVar7 = nIter;
      iVar6 = status;
      iVar5 = RetValue;
      iVar4 = local_58;
      pGVar3 = pLast;
      iVar8 = Cost;
      if (clkTotal._4_4_ != 0) {
        aVar11 = Abc_Clock();
        Cec_GiaSplitPrint(iVar5,iVar8,iVar7,iVar6,iVar4,(double)pGVar3,aVar11 - (long)vStack);
      }
      if (local_58 == 0) {
        _nTimeOut_local->pCexComb = pGVar12->pCexComb;
        pGVar12->pCexComb = (Abc_Cex_t *)0x0;
        Gia_ManStop(pGVar12);
        Progress._4_4_ = 0;
        break;
      }
      if (local_58 == 1) {
        Gia_ManStop(pGVar12);
      }
      else {
        Vec_PtrPush((Vec_Ptr_t *)pCnf,pGVar12);
      }
      if ((fVerbose_local != 0) && (fVerbose_local <= RetValue)) break;
      RetValue = RetValue + 1;
    }
    iVar8 = Vec_PtrSize((Vec_Ptr_t *)pCnf);
    if (iVar8 == 0) {
      Progress._4_4_ = 1;
    }
    Cec_GiaSplitClean((Vec_Ptr_t *)pCnf);
    if (fSilent == 0) {
      if (Progress._4_4_ == 0) {
        printf("Problem is SAT ");
      }
      else if (Progress._4_4_ == 1) {
        printf("Problem is UNSAT ");
      }
      else {
        if (Progress._4_4_ != -1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSplit.c"
                        ,0x209,
                        "int Cec_GiaSplitTest2(Gia_Man_t *, int, int, int, int, int, int, int)");
        }
        printf("Problem is UNDECIDED ");
      }
      printf("after %d case-splits.  ",(ulong)(uint)RetValue);
      aVar11 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar11 - (long)vStack);
      fflush(_stdout);
    }
    p_local._4_4_ = Progress._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

int Cec_GiaSplitTest2( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    int nSatVars, nSatConfs;
    int nIter, status, RetValue = -1;
    double Progress = 0;
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
		if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
		if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start with the current problem
    for ( nIter = 1; Vec_PtrSize(vStack) > 0; nIter++ )
    {
        // get the last AIG
        Gia_Man_t * pLast = (Gia_Man_t *)Vec_PtrPop( vStack );
        // determine cofactoring variable
        int Depth = 1 + (pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0);
        int nFanouts, Cost, iVar  = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
        // cofactor
        Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
        if ( pLast->vCofVars == NULL )
            pLast->vCofVars = Vec_IntAlloc( 100 );
        // print results
        if ( fVeryVerbose )
        {
//            Cec_GiaSplitPrintRefs( pLast );
            printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//            Cec_GiaSplitPrintRefs( pPart );
        }
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose ) 
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pLast );
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        // cofactor
        pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 0) );
        Gia_ManStop( pLast );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose )
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( Vec_PtrSize(vStack) == 0 )
        RetValue = 1;
    // finish
    Cec_GiaSplitClean( vStack );
	if ( !fSilent )
	{
		if ( RetValue == 0 )
			printf( "Problem is SAT " );
		else if ( RetValue == 1 )
			printf( "Problem is UNSAT " );
		else if ( RetValue == -1 )
			printf( "Problem is UNDECIDED " );
		else assert( 0 );
		printf( "after %d case-splits.  ", nIter );
		Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
		fflush( stdout );
	}
    return RetValue;
}